

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddCircleFilled(ImDrawList *this,ImVec2 *centre,float radius,ImU32 col,int num_segments)

{
  int *piVar1;
  ImVec2 *__dest;
  ImGuiContext *pIVar2;
  ImVec2 *pIVar3;
  
  if (col < 0x1000000) {
    return;
  }
  PathArcTo(this,centre,radius,0.0,(((float)num_segments + -1.0) * 6.2831855) / (float)num_segments,
            num_segments);
  AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col,true);
  pIVar2 = GImGui;
  if (-1 < (this->_Path).Capacity) goto LAB_001353ab;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImVec2 *)(*(pIVar2->IO).MemAllocFn)(0);
  pIVar3 = (this->_Path).Data;
  if (pIVar3 == (ImVec2 *)0x0) {
LAB_00135398:
    pIVar3 = (ImVec2 *)0x0;
    pIVar2 = GImGui;
  }
  else {
    memcpy(__dest,pIVar3,(long)(this->_Path).Size << 3);
    pIVar2 = GImGui;
    pIVar3 = (this->_Path).Data;
    if (pIVar3 == (ImVec2 *)0x0) goto LAB_00135398;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar2->IO).MemFreeFn)(pIVar3);
  (this->_Path).Data = __dest;
  (this->_Path).Capacity = 0;
LAB_001353ab:
  (this->_Path).Size = 0;
  return;
}

Assistant:

void ImDrawList::AddCircleFilled(const ImVec2& centre, float radius, ImU32 col, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    const float a_max = IM_PI*2.0f * ((float)num_segments - 1.0f) / (float)num_segments;
    PathArcTo(centre, radius, 0.0f, a_max, num_segments);
    PathFill(col);
}